

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O0

bool __thiscall Js::FunctionBody::CanFunctionObjectHaveInlineCaches(FunctionBody *this)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  LocalFunctionId functionId;
  uint uVar5;
  int byteCodeSizeThreshold;
  uint totalCacheCount;
  FunctionBody *this_local;
  
  bVar1 = ParseableFunctionInfo::DoStackNestedFunc(&this->super_ParseableFunctionInfo);
  if ((bVar1) || (bVar1 = FunctionProxy::IsCoroutine((FunctionProxy *)this), bVar1)) {
    this_local._7_1_ = false;
  }
  else {
    uVar2 = GetInlineCacheCount(this);
    uVar3 = GetIsInstInlineCacheCount(this);
    uVar4 = uVar2 + uVar3;
    uVar2 = FunctionProxy::GetSourceContextId((FunctionProxy *)this);
    functionId = FunctionProxy::GetLocalFunctionId((FunctionProxy *)this);
    bVar1 = Phases::IsEnabled((Phases *)&DAT_01ea41a0,ScriptFunctionWithInlineCachePhase,uVar2,
                              functionId);
    if ((bVar1) && (uVar4 != 0)) {
      this_local._7_1_ = true;
    }
    else {
      uVar5 = DAT_01ea9f54 + DAT_01ea9f68;
      if (((int)uVar5 < 0) || (uVar2 = GetByteCodeWithoutLDACount(this), uVar5 < uVar2)) {
        this_local._7_1_ = false;
      }
      else if (((int)DAT_01eafdd8 < 0) || ((DAT_01eafdd8 < uVar4 || (uVar4 == 0)))) {
        this_local._7_1_ = false;
      }
      else {
        this_local._7_1_ = true;
      }
    }
  }
  return this_local._7_1_;
}

Assistant:

bool FunctionBody::CanFunctionObjectHaveInlineCaches()
    {
        if (this->DoStackNestedFunc() || this->IsCoroutine())
        {
            return false;
        }

        uint totalCacheCount = this->GetInlineCacheCount() + this->GetIsInstInlineCacheCount();
        if (PHASE_FORCE(Js::ScriptFunctionWithInlineCachePhase, this) && totalCacheCount > 0)
        {
            return true;
        }

        // Only have inline caches on function object for possible inlining candidates.
        // Since we don't know the size of the top function, check against the maximum possible inline threshold
        // Negative inline byte code size threshold will disable inline cache on function object.
        const int byteCodeSizeThreshold = CONFIG_FLAG(InlineThreshold) + CONFIG_FLAG(InlineThresholdAdjustCountInSmallFunction);
        if (byteCodeSizeThreshold < 0 || this->GetByteCodeWithoutLDACount() > (uint)byteCodeSizeThreshold)
        {
            return false;
        }
        // Negative FuncObjectInlineCacheThreshold will disable inline cache on function object.
        if (CONFIG_FLAG(FuncObjectInlineCacheThreshold) < 0 || totalCacheCount > (uint)CONFIG_FLAG(FuncObjectInlineCacheThreshold) || totalCacheCount == 0)
        {
            return false;
        }

        return true;
    }